

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O2

void __thiscall PressDelayHandler::~PressDelayHandler(PressDelayHandler *this)

{
  QMouseEvent *pQVar1;
  
  *(undefined ***)this = &PTR_metaObject_007ef8a0;
  QWeakPointer<QObject>::~QWeakPointer(&(this->mouseTarget).wp);
  pQVar1 = (this->pressDelayEvent).d;
  if (pQVar1 != (QMouseEvent *)0x0) {
    (**(code **)(*(long *)pQVar1 + 8))();
  }
  QBasicTimer::~QBasicTimer(&this->pressDelayTimer);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

PressDelayHandler(QObject *parent = nullptr)
        : QObject(parent)
        , sendingEvent(false)
        , mouseButton(Qt::NoButton)
        , mouseTarget(nullptr)
        , mouseEventSource(Qt::MouseEventNotSynthesized)
    { }